

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityFail(char *msg,_U_UINT line)

{
  _U_UINT line_local;
  char *msg_local;
  
  if ((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) {
    UnityTestResultsBegin(Unity.TestFile,line);
    UnityPrintFail();
    if (msg != (char *)0x0) {
      putchar(0x3a);
      if (Unity.CurrentDetail1 != (char *)0x0) {
        UnityPrint("Function ");
        UnityPrint(Unity.CurrentDetail1);
        if (Unity.CurrentDetail2 != (char *)0x0) {
          UnityPrint(" Argument ");
          UnityPrint(Unity.CurrentDetail2);
        }
        UnityPrint(". ");
      }
      if (*msg != ' ') {
        putchar(0x20);
      }
      UnityPrint(msg);
    }
    Unity.CurrentTestFailed = 1;
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
  return;
}

Assistant:

void UnityFail(const char* msg, const UNITY_LINE_TYPE line)
{
    UNITY_SKIP_EXECUTION;

    UnityTestResultsBegin(Unity.TestFile, line);
    UnityPrintFail();
    if (msg != NULL)
    {
        UNITY_OUTPUT_CHAR(':');

#ifndef UNITY_EXCLUDE_DETAILS
        if (Unity.CurrentDetail1)
        {
            UnityPrint(UnityStrDetail1Name);
            UnityPrint(Unity.CurrentDetail1);
            if (Unity.CurrentDetail2)
            {
                UnityPrint(UnityStrDetail2Name);
                UnityPrint(Unity.CurrentDetail2);
            }
            UnityPrint(UnityStrSpacer);
        }
#endif
        if (msg[0] != ' ')
        {
            UNITY_OUTPUT_CHAR(' ');
        }
        UnityPrint(msg);
    }

    UNITY_FAIL_AND_BAIL;
}